

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_WoW6.cpp
# Opt level: O0

LPBYTE __thiscall TRootHandler_WoW6::Search(TRootHandler_WoW6 *this,TCascSearch *pSearch)

{
  bool bVar1;
  size_t sVar2;
  LPBYTE pbEKey;
  PCASC_FILE_NODE pFileNode;
  TCascSearch *pSearch_local;
  TRootHandler_WoW6 *this_local;
  
  this_local = (TRootHandler_WoW6 *)TFileTreeRoot::Search(&this->super_TFileTreeRoot,pSearch);
  if (this_local == (TRootHandler_WoW6 *)0x0) {
    if (pSearch->pCache == (void *)0x0) {
LAB_0012867f:
      this_local = (TRootHandler_WoW6 *)0x0;
    }
    else {
      do {
        sVar2 = ListFile_GetNext(pSearch->pCache,pSearch->szMask,pSearch->szFileName,0x400);
        if (sVar2 == 0) goto LAB_0012867f;
        bVar1 = CheckWildCard(pSearch->szFileName,pSearch->szMask);
      } while ((!bVar1) ||
              (this_local = (TRootHandler_WoW6 *)
                            CASC_FILE_TREE::Find
                                      (&(this->super_TFileTreeRoot).FileTree,pSearch->szFileName,
                                       (PDWORD)0x0),
              (PCASC_FILE_NODE)this_local == (PCASC_FILE_NODE)0x0));
      CASC_FILE_TREE::GetExtras
                (&(this->super_TFileTreeRoot).FileTree,(PCASC_FILE_NODE)this_local,
                 &pSearch->dwFileDataId,(PDWORD)0x0,&pSearch->dwLocaleFlags);
    }
  }
  return (LPBYTE)this_local;
}

Assistant:

LPBYTE Search(TCascSearch * pSearch)
    {
        PCASC_FILE_NODE pFileNode;
        LPBYTE pbEKey;

        // Try to find named items
        pbEKey = TFileTreeRoot::Search(pSearch);
        if(pbEKey != NULL)
            return pbEKey;

        // Only if we have a listfile
        if(pSearch->pCache != NULL)
        {
            // Keep going through the listfile
            while(ListFile_GetNext(pSearch->pCache, pSearch->szMask, pSearch->szFileName, MAX_PATH))
            {
                // Check the wildcard first
                if (CheckWildCard(pSearch->szFileName, pSearch->szMask))
                {
                    // Retrieve the file item
                    pFileNode = FileTree.Find(pSearch->szFileName, NULL);
                    if(pFileNode != NULL)
                    {
                        FileTree.GetExtras(pFileNode, &pSearch->dwFileDataId, NULL, &pSearch->dwLocaleFlags);
                        return pFileNode->CKey.Value;
                    }
                }
            }
        }

        // No more files
        return NULL;
    }